

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_sde.c
# Opt level: O0

void beltSDEStepE(void *buf,size_t count,octet *iv,void *state)

{
  u32 *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ulong *in_RDI;
  belt_sde_st *st;
  u32 *state_00;
  
  state_00 = in_RCX;
  memCopy(in_RCX,in_RCX,0x159a28);
  beltBlockEncr((octet *)(in_RCX + 0x12),in_RCX);
  *in_RDI = *(ulong *)(in_RCX + 0x12) ^ *in_RDI;
  in_RDI[1] = *(ulong *)(in_RCX + 0x14) ^ in_RDI[1];
  beltWBLStepE(in_RSI,in_RDX,state_00);
  *in_RDI = *(ulong *)(in_RCX + 0x12) ^ *in_RDI;
  in_RDI[1] = *(ulong *)(in_RCX + 0x14) ^ in_RDI[1];
  return;
}

Assistant:

void beltSDEStepE(void* buf, size_t count, const octet iv[16], void* state)
{
	belt_sde_st* st = (belt_sde_st*)state;
	ASSERT(count % 16 == 0 && count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltSDE_keep()));
	ASSERT(memIsValid(iv, 16));
	// зашифровать синхропосылку
	memCopy(st->s, iv, 16);
	beltBlockEncr(st->s, st->wbl->key);
	// каскад XEX
	beltBlockXor2(buf, st->s);
	beltWBLStepE(buf, count, st->wbl);
	beltBlockXor2(buf, st->s);
}